

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O2

int ndn_name_tlv_decode(ndn_decoder_t *decoder,ndn_name_t *name)

{
  int iVar1;
  long lVar2;
  ndn_name_t *component;
  uint uVar3;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t type;
  uint32_t length;
  
  local_38 = 0;
  iVar1 = decoder_get_var(decoder,&local_38);
  if (iVar1 == 0) {
    if (local_38 == 7) {
      local_34 = 0;
      iVar1 = decoder_get_var(decoder,&local_34);
      if (iVar1 == 0) {
        uVar3 = local_34 + decoder->offset;
        lVar2 = 0;
        component = name;
        do {
          if (uVar3 <= decoder->offset) {
            name->components_size = (uint8_t)lVar2;
            return 0;
          }
          if (lVar2 == 10) {
            return -10;
          }
          iVar1 = name_component_tlv_decode(decoder,component->components);
          lVar2 = lVar2 + 1;
          component = (ndn_name_t *)(component->components + 1);
        } while (-1 < iVar1);
      }
    }
    else {
      iVar1 = -0xc;
    }
  }
  return iVar1;
}

Assistant:

int
ndn_name_tlv_decode(ndn_decoder_t* decoder, ndn_name_t* name)
{
  int ret_val = -1;
  uint32_t type = 0;
  ret_val = decoder_get_type(decoder, &type);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (type != TLV_Name) {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t length = 0;
  ret_val = decoder_get_length(decoder, &length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t start_offset = decoder->offset;
  int counter = 0;
  while (decoder->offset < start_offset + length) {
    if (counter >= NDN_NAME_COMPONENTS_SIZE)
      return NDN_OVERSIZE;
    int result = name_component_tlv_decode(decoder, &name->components[counter]);
    if (result < 0)
      return result;
    ++counter;
  }
  name->components_size = counter;
  return 0;
}